

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t update_pack_unpack_ptrs(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  size_t *in_RDI;
  exr_transcoding_pipeline_buffer_id_t unaff_retaddr;
  size_t sampsize;
  exr_storage_t stortype;
  exr_result_t rv;
  long local_20;
  undefined4 in_stack_ffffffffffffffec;
  exr_result_t eVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = (uint)*(byte *)((long)in_RDI + 0x36);
  if ((uVar1 == 2) || (uVar1 == 3)) {
    local_20 = (long)(int)in_RDI[6] * (long)*(int *)((long)in_RDI + 0x2c);
    if ((*(ushort *)((long)in_RDI + 0x12) & 1) != 0) {
      local_20 = local_20 + 1;
    }
    if (in_RDI[0xb] == local_20 << 2) {
      internal_decode_free_buffer
                ((exr_decode_pipeline_t *)sampsize,unaff_retaddr,
                 (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      in_RDI[0x15] = in_RDI[0x13];
      eVar2 = 0;
    }
    else {
      eVar2 = internal_decode_alloc_buffer
                        ((exr_decode_pipeline_t *)sampsize,unaff_retaddr,
                         (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,CONCAT44(in_stack_ffffffffffffffec,uVar1));
    }
    if (eVar2 != 0) {
      return eVar2;
    }
    if ((*(ushort *)((long)in_RDI + 0x12) & 4) != 0) {
      return 0;
    }
    in_stack_ffffffffffffffec = 0;
  }
  if (in_RDI[8] == in_RDI[9]) {
    internal_decode_free_buffer
              ((exr_decode_pipeline_t *)sampsize,unaff_retaddr,
               (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    in_RDI[0x11] = in_RDI[0xf];
    eVar2 = 0;
  }
  else {
    eVar2 = internal_decode_alloc_buffer
                      ((exr_decode_pipeline_t *)sampsize,unaff_retaddr,
                       (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                       ,CONCAT44(in_stack_ffffffffffffffec,uVar1));
  }
  return eVar2;
}

Assistant:

static exr_result_t
update_pack_unpack_ptrs (exr_decode_pipeline_t* decode)
{
    exr_result_t  rv;
    exr_storage_t stortype = ((exr_storage_t) decode->chunk.type);

    if (stortype == EXR_STORAGE_DEEP_SCANLINE ||
        stortype == EXR_STORAGE_DEEP_TILED)
    {
        size_t sampsize =
            (((size_t) decode->chunk.width) * ((size_t) decode->chunk.height));

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
            sampsize += 1;
        sampsize *= sizeof (int32_t);

        if (decode->chunk.sample_count_table_size == sampsize)
        {
            internal_decode_free_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_SAMPLES,
                (void**) &(decode->sample_count_table),
                &(decode->sample_count_alloc_size));

            decode->sample_count_table = decode->packed_sample_count_table;
            rv                         = EXR_ERR_SUCCESS;
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_SAMPLES,
                (void**) &(decode->sample_count_table),
                &(decode->sample_count_alloc_size),
                sampsize);
        }

        if (rv != EXR_ERR_SUCCESS ||
            (decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY) != 0)
            return rv;
    }

    if (decode->chunk.packed_size == decode->chunk.unpacked_size)
    {
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size));

        decode->unpacked_buffer = decode->packed_buffer;
        rv                      = EXR_ERR_SUCCESS;
    }
    else
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size),
            decode->chunk.unpacked_size);
    }

    return rv;
}